

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::operator<<
          (LogMessage *this,_func_ios_base_ptr_ios_base_ptr *m)

{
  type message_data;
  pointer pLVar1;
  undefined1 local_90 [8];
  OstreamView view;
  _func_ios_base_ptr_ios_base_ptr *m_local;
  LogMessage *this_local;
  
  view.string_start_.len_ = (size_type)m;
  message_data = std::
                 unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                 ::operator*(&this->data_);
  OstreamView::OstreamView((OstreamView *)local_90,message_data);
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  std::ostream::operator<<
            (&pLVar1->manipulated,(_func_ios_base_ptr_ios_base_ptr *)view.string_start_.len_);
  OstreamView::~OstreamView((OstreamView *)local_90);
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(std::ios_base& (*m)(std::ios_base& os)) {
  OstreamView view(*data_);
  data_->manipulated << m;
  return *this;
}